

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vampire.cpp
# Opt level: O0

void preprocessMode(Problem *problem,bool theory)

{
  bool bVar1;
  InferenceRule IVar2;
  UnitInputType UVar3;
  byte bVar4;
  Mode MVar5;
  Problem *this;
  UnitList **ppUVar6;
  Inference *pIVar7;
  Formula *f_00;
  Inference *this_00;
  void *pvVar8;
  ostream *poVar9;
  byte in_SIL;
  Problem *in_RDI;
  FormulaUnit *fu;
  Formula *f;
  Unit *u;
  Iterator units;
  Preprocess prepro;
  ScopedPtr<Kernel::Problem> prb;
  Problem *in_stack_00000180;
  Unit *in_stack_000001b8;
  Problem *in_stack_00000398;
  Preprocess *in_stack_000003a0;
  Options *in_stack_fffffffffffffe98;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  ostream *in_stack_fffffffffffffeb0;
  undefined7 in_stack_fffffffffffffef0;
  InferenceRule in_stack_fffffffffffffef7;
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  void *local_58;
  Formula *local_50;
  Unit *local_48;
  Iterator local_40 [3];
  Preprocess local_28;
  ScopedPtr<Kernel::Problem> local_18;
  byte local_9;
  
  local_9 = in_SIL & 1;
  Lib::ScopedPtr<Kernel::Problem>::ScopedPtr(&local_18,in_RDI);
  Shell::Preprocess::Preprocess(&local_28,Lib::env);
  Shell::Preprocess::turnClausifierOff(&local_28);
  MVar5 = Shell::Options::mode(Lib::env);
  if (MVar5 == PREPROCESS2) {
    Shell::Preprocess::keepSimplifyStep(&local_28);
  }
  Lib::ScopedPtr<Kernel::Problem>::operator*(&local_18);
  Shell::Preprocess::preprocess(in_stack_000003a0,in_stack_00000398);
  Shell::UIHelper::outputSymbolDeclarations(in_stack_fffffffffffffeb0);
  this = Lib::ScopedPtr<Kernel::Problem>::operator->(&local_18);
  ppUVar6 = Kernel::Problem::units(this);
  Lib::List<Kernel::Unit_*>::Iterator::Iterator(local_40,*ppUVar6);
LAB_0018455c:
  bVar1 = Lib::List<Kernel::Unit_*>::Iterator::hasNext((Iterator *)0x184569);
  if (!bVar1) {
    Shell::Options::latexOutput_abi_cxx11_(in_stack_fffffffffffffe98);
    bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                            (char *)in_stack_fffffffffffffe98);
    std::__cxx11::string::~string(local_b8);
    if ((bVar4 & 1) != 0) {
      Lib::ScopedPtr<Kernel::Problem>::ptr(&local_18);
      outputProblemToLaTeX(in_stack_00000180);
    }
    vampireReturnValue = 0;
    Lib::ScopedPtr<Kernel::Problem>::~ScopedPtr
              ((ScopedPtr<Kernel::Problem> *)CONCAT17(bVar4,in_stack_fffffffffffffea0));
    return;
  }
  local_48 = Lib::List<Kernel::Unit_*>::Iterator::next
                       ((Iterator *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
  bVar1 = Shell::Options::showFOOL
                    ((Options *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
  if (!bVar1) goto LAB_001845c8;
  goto LAB_00184627;
LAB_001845c8:
  pIVar7 = Kernel::Unit::inference(local_48);
  IVar2 = Kernel::Inference::rule(pIVar7);
  if (IVar2 != FOOL_AXIOM_TRUE_NEQ_FALSE) {
    pIVar7 = Kernel::Unit::inference(local_48);
    in_stack_fffffffffffffef7 = Kernel::Inference::rule(pIVar7);
    if (in_stack_fffffffffffffef7 != FOOL_AXIOM_ALL_IS_TRUE_OR_FALSE) {
LAB_00184627:
      if ((local_9 & 1) == 0) {
        Shell::TPTPPrinter::toString_abi_cxx11_(in_stack_000001b8);
        poVar9 = std::operator<<((ostream *)&std::cout,local_98);
        std::operator<<(poVar9,"\n");
        std::__cxx11::string::~string(local_98);
      }
      else {
        f_00 = Kernel::Unit::getFormula((Unit *)in_stack_fffffffffffffe98);
        local_50 = f_00;
        pIVar7 = Kernel::Unit::inference(local_48);
        UVar3 = Kernel::Inference::inputType(pIVar7);
        if (UVar3 == CONJECTURE) {
          this_00 = Kernel::Unit::inference(local_48);
          Kernel::Inference::setInputType(this_00,NEGATED_CONJECTURE);
        }
        pvVar8 = Kernel::FormulaUnit::operator_new(0x1846b3);
        Kernel::Unit::inference(local_48);
        Kernel::FormulaUnit::FormulaUnit
                  ((FormulaUnit *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),f_00
                   ,pIVar7);
        local_58 = pvVar8;
        Shell::TPTPPrinter::toString_abi_cxx11_(in_stack_000001b8);
        poVar9 = std::operator<<((ostream *)&std::cout,local_78);
        std::operator<<(poVar9,"\n");
        std::__cxx11::string::~string(local_78);
      }
    }
  }
  goto LAB_0018455c;
}

Assistant:

void preprocessMode(Problem* problem, bool theory)
{
  ScopedPtr<Problem> prb(problem);

  TIME_TRACE(TimeTrace::PREPROCESSING);

  // preprocess without clausification
  Shell::Preprocess prepro(*env.options);
  prepro.turnClausifierOff();
  if(env.options->mode() == Options::Mode::PREPROCESS2){
    prepro.keepSimplifyStep();
  }
  prepro.preprocess(*prb);

  //outputSymbolDeclarations also deals with sorts for now
  //UIHelper::outputSortDeclarations(std::cout);
  UIHelper::outputSymbolDeclarations(std::cout);
  UnitList::Iterator units(prb->units());
  while (units.hasNext()) {
    Unit* u = units.next();
    if (!env.options->showFOOL()) {
      if (u->inference().rule() == InferenceRule::FOOL_AXIOM_TRUE_NEQ_FALSE || u->inference().rule() == InferenceRule::FOOL_AXIOM_ALL_IS_TRUE_OR_FALSE) {
        continue;
      }
    }

    if (theory) {
      Formula* f = u->getFormula();

      // CONJECTURE as inputType is evil, as it cannot occur multiple times
      if (u->inference().inputType() == UnitInputType::CONJECTURE) {
        u->inference().setInputType(UnitInputType::NEGATED_CONJECTURE);
      }

      FormulaUnit* fu = new FormulaUnit(f,u->inference()); // we are stealing u's inference which is not nice
      std::cout << TPTPPrinter::toString(fu) << "\n";
    } else {
      std::cout << TPTPPrinter::toString(u) << "\n";
    }
  }

  if(env.options->latexOutput()!="off"){ outputProblemToLaTeX(prb.ptr()); }

  //we have successfully output all clauses, so we'll terminate with zero return value
  vampireReturnValue = VAMP_RESULT_STATUS_SUCCESS;
}